

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O3

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  undefined4 *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  int iVar18;
  undefined4 *puVar19;
  undefined4 *puVar20;
  ulong local_80;
  undefined4 *local_78;
  
  iVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar10 = this->upscale_factor;
  uVar9 = (long)bottom_blob->c / (long)(iVar10 * iVar10);
  iVar18 = (int)uVar9;
  Mat::create(top_blob,iVar10 * iVar1,uVar2 * iVar10,iVar18,bottom_blob->elemsize,
              opt->blob_allocator);
  local_78 = (undefined4 *)top_blob->data;
  iVar10 = -100;
  if ((local_78 != (undefined4 *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < iVar18) {
      sVar4 = top_blob->elemsize;
      uVar3 = this->upscale_factor;
      lVar13 = (long)top_blob->w * sVar4;
      sVar5 = top_blob->cstep;
      local_80 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar6 = bottom_blob->data;
          sVar7 = bottom_blob->cstep;
          sVar8 = bottom_blob->elemsize;
          uVar12 = 0;
          puVar17 = local_78;
          do {
            iVar10 = this->upscale_factor;
            uVar15 = 0;
            puVar16 = puVar17;
            do {
              if (0 < (int)uVar2) {
                puVar19 = (undefined4 *)
                          ((uVar15 + (long)(int)(((int)uVar12 + uVar3 * (int)local_80) * uVar3)) *
                           sVar7 * sVar8 + (long)pvVar6);
                uVar14 = 0;
                puVar11 = puVar16;
                do {
                  puVar20 = puVar11;
                  iVar18 = iVar1;
                  if (0 < iVar1) {
                    do {
                      *puVar20 = *puVar19;
                      puVar19 = puVar19 + 1;
                      puVar20 = puVar20 + iVar10;
                      iVar18 = iVar18 + -1;
                    } while (iVar18 != 0);
                  }
                  uVar14 = uVar14 + 1;
                  puVar11 = (undefined4 *)((long)puVar11 + lVar13 * iVar10);
                } while (uVar14 != uVar2);
              }
              uVar15 = uVar15 + 1;
              puVar16 = puVar16 + 1;
            } while (uVar15 != uVar3);
            uVar12 = uVar12 + 1;
            puVar17 = (undefined4 *)((long)puVar17 + lVar13);
          } while (uVar12 != uVar3);
        }
        local_80 = local_80 + 1;
        local_78 = (undefined4 *)((long)local_78 + sVar4 * sVar5);
      } while (local_80 != (uVar9 & 0xffffffff));
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                const float* sptr = bottom_blob.channel(p*upscale_factor*upscale_factor + sh*upscale_factor + sw);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i*upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}